

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::DoesSampledImageReferenceImage
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          Instruction *image_variable)

{
  IRContext *this_00;
  DefUseManager *def_use_mgr;
  uint32_t uVar1;
  uint32_t uVar2;
  Instruction *pIVar3;
  
  if (sampled_image_inst->opcode_ == OpSampledImage) {
    this_00 = (this->super_Pass).context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    def_use_mgr = (this_00->def_use_mgr_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
    uVar1 = (sampled_image_inst->has_result_id_ & 1) + 1;
    if (sampled_image_inst->has_type_id_ == false) {
      uVar1 = (uint)sampled_image_inst->has_result_id_;
    }
    uVar1 = Instruction::GetSingleWordOperand(sampled_image_inst,uVar1);
    pIVar3 = anon_unknown_18::GetNonCopyObjectDef(def_use_mgr,uVar1);
    if (pIVar3->opcode_ == OpLoad) {
      uVar1 = (pIVar3->has_result_id_ & 1) + 1;
      if (pIVar3->has_type_id_ == false) {
        uVar1 = (uint)pIVar3->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(pIVar3,uVar1);
      pIVar3 = anon_unknown_18::GetNonCopyObjectDef(def_use_mgr,uVar1);
      uVar1 = 0;
      if (pIVar3->opcode_ != OpVariable) {
        return false;
      }
      if (pIVar3->has_result_id_ == true) {
        uVar1 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
      }
      uVar2 = 0;
      if (image_variable->has_result_id_ == true) {
        uVar2 = Instruction::GetSingleWordOperand(image_variable,(uint)image_variable->has_type_id_)
        ;
      }
      return uVar1 == uVar2;
    }
  }
  return false;
}

Assistant:

bool ConvertToSampledImagePass::DoesSampledImageReferenceImage(
    Instruction* sampled_image_inst, Instruction* image_variable) {
  if (sampled_image_inst->opcode() != spv::Op::OpSampledImage) return false;
  auto* def_use_mgr = context()->get_def_use_mgr();
  auto* image_load = GetNonCopyObjectDef(
      def_use_mgr, sampled_image_inst->GetSingleWordInOperand(0u));
  if (image_load->opcode() != spv::Op::OpLoad) return false;
  auto* image =
      GetNonCopyObjectDef(def_use_mgr, image_load->GetSingleWordInOperand(0u));
  return image->opcode() == spv::Op::OpVariable &&
         image->result_id() == image_variable->result_id();
}